

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cio.c
# Opt level: O1

void opj_write_float_LE(OPJ_BYTE *p_buffer,OPJ_FLOAT32 p_value)

{
  OPJ_BYTE OVar1;
  OPJ_BYTE *pOVar2;
  long lVar3;
  OPJ_FLOAT32 p_value_local;
  
  pOVar2 = (OPJ_BYTE *)((long)&p_value_local + 3);
  lVar3 = 0;
  do {
    OVar1 = *pOVar2;
    pOVar2 = pOVar2 + -1;
    p_buffer[lVar3] = OVar1;
    lVar3 = lVar3 + 1;
  } while ((int)lVar3 != 4);
  return;
}

Assistant:

void opj_write_float_LE(OPJ_BYTE * p_buffer, OPJ_FLOAT32 p_value)
{
    const OPJ_BYTE * l_data_ptr = ((const OPJ_BYTE *) &p_value) + sizeof(
                                      OPJ_FLOAT32) - 1;
    OPJ_UINT32 i;
    for (i = 0; i < sizeof(OPJ_FLOAT32); ++i) {
        *(p_buffer++) = *(l_data_ptr--);
    }
}